

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O0

void helper_booke206_tlbflush_ppc64(CPUPPCState_conflict2 *env,target_ulong type)

{
  undefined4 local_1c;
  int flags;
  target_ulong type_local;
  CPUPPCState_conflict2 *env_local;
  
  local_1c = 0;
  if ((type & 2) != 0) {
    local_1c = 2;
  }
  if ((type & 4) != 0) {
    local_1c = local_1c | 1;
  }
  booke206_flush_tlb(env,local_1c,1);
  return;
}

Assistant:

void helper_booke206_tlbflush(CPUPPCState *env, target_ulong type)
{
    int flags = 0;

    if (type & 2) {
        flags |= BOOKE206_FLUSH_TLB1;
    }

    if (type & 4) {
        flags |= BOOKE206_FLUSH_TLB0;
    }

    booke206_flush_tlb(env, flags, 1);
}